

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O0

void anon_unknown.dwarf_67a627::RecordProcesses
               (TIntermediate *intermediate,EShMessages messages,string *sourceEntryPointName)

{
  TIntermediate *pTVar1;
  long lVar2;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_41;
  string local_40;
  string *local_20;
  string *sourceEntryPointName_local;
  TIntermediate *pTStack_10;
  EShMessages messages_local;
  TIntermediate *intermediate_local;
  
  local_20 = sourceEntryPointName;
  sourceEntryPointName_local._4_4_ = messages;
  pTStack_10 = intermediate;
  if ((messages & EShMsgRelaxedErrors) != EShMsgDefault) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"relaxed-errors",&local_41);
    glslang::TIntermediate::addProcess(intermediate,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  pTVar1 = pTStack_10;
  if ((sourceEntryPointName_local._4_4_ & EShMsgSuppressWarnings) != EShMsgDefault) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"suppress-warnings",&local_69);
    glslang::TIntermediate::addProcess(pTVar1,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
  }
  pTVar1 = pTStack_10;
  if ((sourceEntryPointName_local._4_4_ & EShMsgKeepUncalled) != EShMsgDefault) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"keep-uncalled",&local_91);
    glslang::TIntermediate::addProcess(pTVar1,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
  }
  lVar2 = std::__cxx11::string::size();
  pTVar1 = pTStack_10;
  if (lVar2 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"source-entrypoint",&local_b9);
    glslang::TIntermediate::addProcess(pTVar1,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
    glslang::TIntermediate::addProcessArgument(pTStack_10,local_20);
  }
  return;
}

Assistant:

void RecordProcesses(TIntermediate& intermediate, EShMessages messages, const std::string& sourceEntryPointName)
{
    if ((messages & EShMsgRelaxedErrors) != 0)
        intermediate.addProcess("relaxed-errors");
    if ((messages & EShMsgSuppressWarnings) != 0)
        intermediate.addProcess("suppress-warnings");
    if ((messages & EShMsgKeepUncalled) != 0)
        intermediate.addProcess("keep-uncalled");
    if (sourceEntryPointName.size() > 0) {
        intermediate.addProcess("source-entrypoint");
        intermediate.addProcessArgument(sourceEntryPointName);
    }
}